

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O2

void __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodeNumber
          (DynamicIntegerPointsKdTreeDecoder<4> *this,int nbits,uint32_t *value)

{
  FoldedBit32Decoder<draco::RAnsBitDecoder>::DecodeLeastSignificantBits32
            (&this->numbers_decoder_,nbits,value);
  return;
}

Assistant:

void DecodeNumber(int nbits, uint32_t *value) {
    numbers_decoder_.DecodeLeastSignificantBits32(nbits, value);
  }